

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

_Bool GPU_IntersectClipRect(GPU_Target *target,GPU_Rect B,GPU_Rect *result)

{
  _Bool _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  GPU_Rect A;
  
  if (target != (GPU_Target *)0x0) {
    if (target->use_clip_rect == false) {
      uVar3 = CONCAT44((float)target->h,(float)target->w);
      uVar2 = 0;
    }
    else {
      uVar2._0_4_ = (target->clip_rect).x;
      uVar2._4_4_ = (target->clip_rect).y;
      uVar3._0_4_ = (target->clip_rect).w;
      uVar3._4_4_ = (target->clip_rect).h;
    }
    A.w = (float)(int)uVar3;
    A.h = (float)(int)((ulong)uVar3 >> 0x20);
    A.x = (float)(int)uVar2;
    A.y = (float)(int)((ulong)uVar2 >> 0x20);
    _Var1 = GPU_IntersectRect(A,B,result);
    return _Var1;
  }
  return false;
}

Assistant:

GPU_bool GPU_IntersectClipRect(GPU_Target* target, GPU_Rect B, GPU_Rect* result)
{
    if(target == NULL)
        return GPU_FALSE;
    
    if(!target->use_clip_rect)
    {
        GPU_Rect A = {0, 0, target->w, target->h};
        return GPU_IntersectRect(A, B, result);
    }
    
    return GPU_IntersectRect(target->clip_rect, B, result);
}